

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::CompressionParameters> *
kj::_::tryParseAllExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers,
          CompressionParameters *manualConfig)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ArrayPtr<const_char> *pAVar3;
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar4;
  ArrayPtr<const_char> *pAVar5;
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar6;
  undefined1 uVar7;
  int iVar8;
  long in_R8;
  ArrayPtr<const_char> *pAVar9;
  int iVar10;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  bool local_138;
  bool local_137;
  undefined2 local_136;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_130;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_128;
  Maybe<kj::CompressionParameters> local_118;
  Vector<kj::ArrayPtr<const_char>_> local_e8;
  Vector<kj::ArrayPtr<const_char>_> local_c8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_a0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_98;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_90;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_88;
  CompressionParameters local_80;
  CompressionParameters local_58;
  
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts(&local_c8,(_ *)offers.content.ptr,input,(char)in_R8);
  pRVar6 = local_c8.builder.pos;
  if (local_c8.builder.ptr == local_c8.builder.pos) {
    uVar7 = false;
  }
  else {
    uVar7 = (__return_storage_ptr__->ptr).isSet;
    local_136 = *(undefined2 *)&(__return_storage_ptr__->ptr).field_1;
    local_138 = (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet;
    local_130 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                 ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10);
    local_137 = (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet;
    local_128 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                 ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20);
    pAVar9 = local_c8.builder.ptr;
    do {
      input_00.size_ = 0x3b;
      input_00.ptr = (char *)pAVar9->size_;
      splitParts(&local_e8,(_ *)pAVar9->ptr,input_00,(char)in_R8);
      iVar10 = 3;
      if (((local_e8.builder.ptr)->size_ == 0x12) &&
         (iVar8 = bcmp((local_e8.builder.ptr)->ptr,"permessage-deflate",0x12), iVar8 == 0)) {
        tryExtractParameters(&local_118,&local_e8,false);
        uVar2 = local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet;
        uVar1 = local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
        if (local_118.ptr.isSet == true) {
          if (local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
            local_88 = local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
            local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet = false;
          }
          if (local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
            local_90 = local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
            local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet = false;
          }
          iVar10 = 0;
          local_58.outboundNoContextTakeover = local_118.ptr.field_1.value.outboundNoContextTakeover
          ;
          local_58.inboundNoContextTakeover = local_118.ptr.field_1.value.inboundNoContextTakeover;
          local_58.outboundMaxWindowBits.ptr.isSet = (bool)uVar1;
          if ((bool)uVar1 != false) {
            local_58.outboundMaxWindowBits.ptr.field_1 = local_88;
          }
          local_58.inboundMaxWindowBits.ptr.isSet = (bool)uVar2;
          if ((bool)uVar2 != false) {
            local_58.inboundMaxWindowBits.ptr.field_1 = local_90;
          }
          local_80.outboundNoContextTakeover = manualConfig->outboundNoContextTakeover;
          local_80.inboundNoContextTakeover = manualConfig->inboundNoContextTakeover;
          local_80.outboundMaxWindowBits.ptr.isSet = (manualConfig->outboundMaxWindowBits).ptr.isSet
          ;
          if (local_80.outboundMaxWindowBits.ptr.isSet == true) {
            local_80.outboundMaxWindowBits.ptr.field_1 =
                 (manualConfig->outboundMaxWindowBits).ptr.field_1;
          }
          local_80.inboundMaxWindowBits.ptr.isSet = (manualConfig->inboundMaxWindowBits).ptr.isSet;
          if (local_80.inboundMaxWindowBits.ptr.isSet == true) {
            local_80.inboundMaxWindowBits.ptr.field_1 =
                 (manualConfig->inboundMaxWindowBits).ptr.field_1;
          }
          compareClientAndServerConfigs(&local_118,&local_58,&local_80);
          uVar2 = local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet;
          uVar1 = local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
          if (local_118.ptr.isSet == true) {
            if (local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
              local_98 = local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
              local_118.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet = false;
            }
            if (local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
              local_a0 = local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
              local_118.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet = false;
            }
            if ((bool)uVar1 != false) {
              local_130 = local_98;
            }
            local_136 = local_118.ptr.field_1._0_2_;
            if ((bool)uVar2 != false) {
              local_128 = local_a0;
            }
            iVar10 = 1;
            uVar7 = 1;
            local_137 = (bool)uVar2;
            local_138 = (bool)uVar1;
          }
        }
        else {
          iVar10 = 0;
        }
      }
      pAVar5 = local_e8.builder.endPtr;
      pRVar4 = local_e8.builder.pos;
      pAVar3 = local_e8.builder.ptr;
      if (local_e8.builder.ptr != (ArrayPtr<const_char> *)0x0) {
        local_e8.builder.ptr = (ArrayPtr<const_char> *)0x0;
        local_e8.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
        local_e8.builder.endPtr = (ArrayPtr<const_char> *)0x0;
        in_R8 = (long)pAVar5 - (long)pAVar3 >> 4;
        (**(local_e8.builder.disposer)->_vptr_ArrayDisposer)
                  (local_e8.builder.disposer,pAVar3,0x10,(long)pRVar4 - (long)pAVar3 >> 4,in_R8,0);
      }
      if ((iVar10 != 3) && (iVar10 != 0)) goto LAB_00406bd6;
      pAVar9 = pAVar9 + 1;
    } while (pAVar9 != pRVar6);
    uVar7 = 0;
LAB_00406bd6:
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = local_136;
    (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = local_138;
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_130;
    (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = local_137;
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_128;
  }
  pAVar3 = local_c8.builder.endPtr;
  pRVar6 = local_c8.builder.pos;
  pAVar9 = local_c8.builder.ptr;
  (__return_storage_ptr__->ptr).isSet = (bool)uVar7;
  if (local_c8.builder.ptr != (ArrayPtr<const_char> *)0x0) {
    local_c8.builder.ptr = (ArrayPtr<const_char> *)0x0;
    local_c8.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
    local_c8.builder.endPtr = (ArrayPtr<const_char> *)0x0;
    (**(local_c8.builder.disposer)->_vptr_ArrayDisposer)
              (local_c8.builder.disposer,pAVar9,0x10,(long)pRVar6 - (long)pAVar9 >> 4,
               (long)pAVar3 - (long)pAVar9 >> 4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseAllExtensionOffers(StringPtr offers,
    CompressionParameters manualConfig) {
  // Similar to `tryParseExtensionOffers()`, however, this function is called when parsing in
  // `MANUAL_COMPRESSION` mode. In some cases, the server's configuration might not support the
  // `server_no_context_takeover` or `server_max_window_bits` parameters. Essentially, this function
  // will look at all the client's offers, and accept the first one that it can support.
  //
  // We differentiate these functions because in `AUTOMATIC_COMPRESSION` mode, KJ can support these
  // server restricting compression parameters.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      KJ_IF_SOME(finalConfig, compareClientAndServerConfigs(config, manualConfig)) {
        // Found a compatible configuration between the server's config and client's offer.
        return kj::mv(finalConfig);
      }
    }
  }
  return kj::none;
}